

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void highbd_clamp_epi32_sse4_1
               (__m128i *in,__m128i *out,__m128i *clamp_lo,__m128i *clamp_hi,int size)

{
  longlong lVar1;
  longlong lVar2;
  __m128i *palVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int local_15c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int i;
  __m128i a1;
  __m128i a0;
  int iStack_48;
  int size_local;
  __m128i *clamp_hi_local;
  __m128i *clamp_lo_local;
  __m128i *out_local;
  __m128i *in_local;
  int iStack_20;
  int iStack_1c;
  
  for (local_15c = 0; local_15c < size; local_15c = local_15c + 4) {
    lVar1 = in[local_15c][0];
    lVar2 = in[local_15c][1];
    local_98 = (int)lVar1;
    iStack_94 = (int)((ulong)lVar1 >> 0x20);
    iStack_90 = (int)lVar2;
    iStack_8c = (int)((ulong)lVar2 >> 0x20);
    local_a8 = (int)(*clamp_lo)[0];
    iStack_a4 = (int)((ulong)(*clamp_lo)[0] >> 0x20);
    iStack_a0 = (int)(*clamp_lo)[1];
    iStack_9c = (int)((ulong)(*clamp_lo)[1] >> 0x20);
    uVar4 = (uint)(local_98 < local_a8) * local_a8 | (uint)(local_98 >= local_a8) * local_98;
    uVar5 = (uint)(iStack_94 < iStack_a4) * iStack_a4 | (uint)(iStack_94 >= iStack_a4) * iStack_94;
    uVar6 = (uint)(iStack_90 < iStack_a0) * iStack_a0 | (uint)(iStack_90 >= iStack_a0) * iStack_90;
    uVar7 = (uint)(iStack_8c < iStack_9c) * iStack_9c | (uint)(iStack_8c >= iStack_9c) * iStack_8c;
    in_local._0_4_ = (int)(*clamp_hi)[0];
    in_local._4_4_ = (int)((ulong)(*clamp_hi)[0] >> 0x20);
    iStack_20 = (int)(*clamp_hi)[1];
    iStack_1c = (int)((ulong)(*clamp_hi)[1] >> 0x20);
    palVar3 = out + local_15c;
    *(uint *)*palVar3 =
         (uint)((int)in_local < (int)uVar4) * (int)in_local | ((int)in_local >= (int)uVar4) * uVar4;
    *(uint *)((long)*palVar3 + 4) =
         (uint)(in_local._4_4_ < (int)uVar5) * in_local._4_4_ |
         (in_local._4_4_ >= (int)uVar5) * uVar5;
    *(uint *)(*palVar3 + 1) =
         (uint)(iStack_20 < (int)uVar6) * iStack_20 | (iStack_20 >= (int)uVar6) * uVar6;
    *(uint *)((long)*palVar3 + 0xc) =
         (uint)(iStack_1c < (int)uVar7) * iStack_1c | (iStack_1c >= (int)uVar7) * uVar7;
    lVar1 = in[local_15c + 1][0];
    lVar2 = in[local_15c + 1][1];
    local_b8 = (int)lVar1;
    iStack_b4 = (int)((ulong)lVar1 >> 0x20);
    iStack_b0 = (int)lVar2;
    iStack_ac = (int)((ulong)lVar2 >> 0x20);
    local_c8 = (int)(*clamp_lo)[0];
    iStack_c4 = (int)((ulong)(*clamp_lo)[0] >> 0x20);
    iStack_c0 = (int)(*clamp_lo)[1];
    iStack_bc = (int)((ulong)(*clamp_lo)[1] >> 0x20);
    uVar4 = (uint)(local_b8 < local_c8) * local_c8 | (uint)(local_b8 >= local_c8) * local_b8;
    uVar5 = (uint)(iStack_b4 < iStack_c4) * iStack_c4 | (uint)(iStack_b4 >= iStack_c4) * iStack_b4;
    uVar6 = (uint)(iStack_b0 < iStack_c0) * iStack_c0 | (uint)(iStack_b0 >= iStack_c0) * iStack_b0;
    uVar7 = (uint)(iStack_ac < iStack_bc) * iStack_bc | (uint)(iStack_ac >= iStack_bc) * iStack_ac;
    iStack_48 = (int)(*clamp_hi)[0];
    size_local = (int)((ulong)(*clamp_hi)[0] >> 0x20);
    clamp_hi_local._0_4_ = (int)(*clamp_hi)[1];
    clamp_hi_local._4_4_ = (int)((ulong)(*clamp_hi)[1] >> 0x20);
    palVar3 = out + (local_15c + 1);
    *(uint *)*palVar3 =
         (uint)(iStack_48 < (int)uVar4) * iStack_48 | (iStack_48 >= (int)uVar4) * uVar4;
    *(uint *)((long)*palVar3 + 4) =
         (uint)(size_local < (int)uVar5) * size_local | (size_local >= (int)uVar5) * uVar5;
    *(uint *)(*palVar3 + 1) =
         (uint)((int)clamp_hi_local < (int)uVar6) * (int)clamp_hi_local |
         ((int)clamp_hi_local >= (int)uVar6) * uVar6;
    *(uint *)((long)*palVar3 + 0xc) =
         (uint)(clamp_hi_local._4_4_ < (int)uVar7) * clamp_hi_local._4_4_ |
         (clamp_hi_local._4_4_ >= (int)uVar7) * uVar7;
    lVar1 = in[local_15c + 2][0];
    lVar2 = in[local_15c + 2][1];
    local_d8 = (int)lVar1;
    iStack_d4 = (int)((ulong)lVar1 >> 0x20);
    iStack_d0 = (int)lVar2;
    iStack_cc = (int)((ulong)lVar2 >> 0x20);
    local_e8 = (int)(*clamp_lo)[0];
    iStack_e4 = (int)((ulong)(*clamp_lo)[0] >> 0x20);
    iStack_e0 = (int)(*clamp_lo)[1];
    iStack_dc = (int)((ulong)(*clamp_lo)[1] >> 0x20);
    uVar4 = (uint)(local_d8 < local_e8) * local_e8 | (uint)(local_d8 >= local_e8) * local_d8;
    uVar5 = (uint)(iStack_d4 < iStack_e4) * iStack_e4 | (uint)(iStack_d4 >= iStack_e4) * iStack_d4;
    uVar6 = (uint)(iStack_d0 < iStack_e0) * iStack_e0 | (uint)(iStack_d0 >= iStack_e0) * iStack_d0;
    uVar7 = (uint)(iStack_cc < iStack_dc) * iStack_dc | (uint)(iStack_cc >= iStack_dc) * iStack_cc;
    a1[1]._0_4_ = (int)(*clamp_hi)[0];
    a1[1]._4_4_ = (int)((ulong)(*clamp_hi)[0] >> 0x20);
    a0[0]._0_4_ = (int)(*clamp_hi)[1];
    a0[0]._4_4_ = (int)((ulong)(*clamp_hi)[1] >> 0x20);
    palVar3 = out + (local_15c + 2);
    *(uint *)*palVar3 =
         (uint)((int)a1[1] < (int)uVar4) * (int)a1[1] | ((int)a1[1] >= (int)uVar4) * uVar4;
    *(uint *)((long)*palVar3 + 4) =
         (uint)(a1[1]._4_4_ < (int)uVar5) * a1[1]._4_4_ | (a1[1]._4_4_ >= (int)uVar5) * uVar5;
    *(uint *)(*palVar3 + 1) =
         (uint)((int)a0[0] < (int)uVar6) * (int)a0[0] | ((int)a0[0] >= (int)uVar6) * uVar6;
    *(uint *)((long)*palVar3 + 0xc) =
         (uint)(a0[0]._4_4_ < (int)uVar7) * a0[0]._4_4_ | (a0[0]._4_4_ >= (int)uVar7) * uVar7;
    lVar1 = in[local_15c + 3][0];
    lVar2 = in[local_15c + 3][1];
    local_f8 = (int)lVar1;
    iStack_f4 = (int)((ulong)lVar1 >> 0x20);
    iStack_f0 = (int)lVar2;
    iStack_ec = (int)((ulong)lVar2 >> 0x20);
    local_108 = (int)(*clamp_lo)[0];
    iStack_104 = (int)((ulong)(*clamp_lo)[0] >> 0x20);
    iStack_100 = (int)(*clamp_lo)[1];
    iStack_fc = (int)((ulong)(*clamp_lo)[1] >> 0x20);
    uVar4 = (uint)(local_f8 < local_108) * local_108 | (uint)(local_f8 >= local_108) * local_f8;
    uVar5 = (uint)(iStack_f4 < iStack_104) * iStack_104 |
            (uint)(iStack_f4 >= iStack_104) * iStack_f4;
    uVar6 = (uint)(iStack_f0 < iStack_100) * iStack_100 |
            (uint)(iStack_f0 >= iStack_100) * iStack_f0;
    uVar7 = (uint)(iStack_ec < iStack_fc) * iStack_fc | (uint)(iStack_ec >= iStack_fc) * iStack_ec;
    local_88 = (int)(*clamp_hi)[0];
    iStack_84 = (int)((ulong)(*clamp_hi)[0] >> 0x20);
    iStack_80 = (int)(*clamp_hi)[1];
    iStack_7c = (int)((ulong)(*clamp_hi)[1] >> 0x20);
    palVar3 = out + (local_15c + 3);
    *(uint *)*palVar3 = (uint)(local_88 < (int)uVar4) * local_88 | (local_88 >= (int)uVar4) * uVar4;
    *(uint *)((long)*palVar3 + 4) =
         (uint)(iStack_84 < (int)uVar5) * iStack_84 | (iStack_84 >= (int)uVar5) * uVar5;
    *(uint *)(*palVar3 + 1) =
         (uint)(iStack_80 < (int)uVar6) * iStack_80 | (iStack_80 >= (int)uVar6) * uVar6;
    *(uint *)((long)*palVar3 + 0xc) =
         (uint)(iStack_7c < (int)uVar7) * iStack_7c | (iStack_7c >= (int)uVar7) * uVar7;
  }
  return;
}

Assistant:

static void highbd_clamp_epi32_sse4_1(__m128i *in, __m128i *out,
                                      const __m128i *clamp_lo,
                                      const __m128i *clamp_hi, int size) {
  __m128i a0, a1;
  for (int i = 0; i < size; i += 4) {
    a0 = _mm_max_epi32(in[i], *clamp_lo);
    out[i] = _mm_min_epi32(a0, *clamp_hi);

    a1 = _mm_max_epi32(in[i + 1], *clamp_lo);
    out[i + 1] = _mm_min_epi32(a1, *clamp_hi);

    a0 = _mm_max_epi32(in[i + 2], *clamp_lo);
    out[i + 2] = _mm_min_epi32(a0, *clamp_hi);

    a1 = _mm_max_epi32(in[i + 3], *clamp_lo);
    out[i + 3] = _mm_min_epi32(a1, *clamp_hi);
  }
}